

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O2

bool gerr::IsCode<gerr::details::IError,void>(int code,shared_ptr<gerr::details::IError> *err)

{
  long local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  AsCode<gerr::details::IError,void>((gerr *)&local_18,code,err);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return local_18 != 0;
}

Assistant:

bool IsCode(int code, std::shared_ptr<ErrType> const& err) {
  return AsCode(code, err) != nullptr;
}